

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void rshift256(uint16_t *out,uint16_t *a,int n,int sign_extend)

{
  ushort uVar1;
  int iVar2;
  bool local_2d;
  int frompos;
  uint16_t v;
  int j;
  int i;
  uint16_t sign;
  int sign_extend_local;
  int n_local;
  uint16_t *a_local;
  uint16_t *out_local;
  
  local_2d = false;
  if (sign_extend != 0) {
    local_2d = (int)(uint)a[0xf] >> 0xf != 0;
  }
  for (i = 0xf; -1 < i; i = i + -1) {
    v = 0;
    for (j = 0; j < 0x10; j = j + 1) {
      iVar2 = i * 0x10 + j + n;
      if (iVar2 < 0x100) {
        uVar1 = (ushort)(((int)(uint)a[iVar2 >> 4] >> ((byte)iVar2 & 0xf) & 1U) << ((byte)j & 0x1f))
        ;
      }
      else {
        uVar1 = (ushort)local_2d << ((byte)j & 0x1f);
      }
      v = v | uVar1;
    }
    out[i] = v;
  }
  return;
}

Assistant:

static void rshift256(uint16_t* out, const uint16_t* a, int n, int sign_extend) {
    uint16_t sign = sign_extend && (a[15] >> 15);
    int i, j;
    for (i = 15; i >= 0; --i) {
        uint16_t v = 0;
        for (j = 0; j < 16; ++j) {
            int frompos = i*16 + j + n;
            if (frompos >= 256) {
                v |= sign << j;
            } else {
                v |= ((uint16_t)((a[frompos >> 4] >> (frompos & 15)) & 1)) << j;
            }
        }
        out[i] = v;
    }
}